

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_read_mtx_array_size(FILE *f,int *M,int *N)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char line [1025];
  
  *N = 0;
  *M = 0;
  do {
    pcVar2 = fgets(line,0x401,(FILE *)f);
    if (pcVar2 == (char *)0x0) goto LAB_00103cc9;
  } while (line[0] == '%');
  iVar3 = 0;
  iVar1 = __isoc99_sscanf(line,"%d %d",M,N);
  if (iVar1 != 2) {
    do {
      iVar1 = __isoc99_fscanf(f,"%d %d",M,N);
      if (iVar1 == 2) {
        return 0;
      }
    } while (iVar1 != -1);
LAB_00103cc9:
    iVar3 = 0xc;
  }
  return iVar3;
}

Assistant:

int mm_read_mtx_array_size(FILE *f, int *M, int *N) {
    char line[MM_MAX_LINE_LENGTH];
    int num_items_read;
    /* set return null parameter values, in case we exit with errors */
    *M = *N = 0;

    /* now continue scanning until you reach the end-of-comments */
    do {
        if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
            return MM_PREMATURE_EOF;
    } while (line[0] == '%');

    /* line[] is either blank or has M,N, nz */
    if (sscanf(line, "%d %d", M, N) == 2)
        return 0;

    else /* we have a blank line */
        do {
            num_items_read = fscanf(f, "%d %d", M, N);
            if (num_items_read == EOF) return MM_PREMATURE_EOF;
        } while (num_items_read != 2);

    return 0;
}